

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roots.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> *
opengv::math::o3_roots
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          vector<double,_std::allocator<double>_> *p)

{
  undefined1 auVar1 [16];
  double *pdVar2;
  iterator iVar3;
  undefined8 uVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ulong extraout_XMM0_Qb;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  complex<double> local_68;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  double local_30;
  double local_28;
  
  pdVar2 = (p->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  dVar6 = *pdVar2;
  dVar9 = pdVar2[1];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar9;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar6 * -3.0 * pdVar2[2];
  auVar10 = vfmadd231sd_fma(auVar19,auVar13,auVar13);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = pdVar2[2] * dVar9 * dVar6 * -9.0;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar9 * (dVar9 + dVar9);
  auVar13 = vfmadd231sd_fma(auVar15,auVar13,auVar17);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = pdVar2[3];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar6 * dVar6 * 27.0;
  auVar1 = vfmadd132sd_fma(auVar18,auVar13,auVar1);
  dVar9 = auVar10._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar9 * dVar9 * dVar9 * -4.0;
  auVar10 = vfmadd231sd_fma(auVar10,auVar1,auVar1);
  dVar6 = auVar10._0_8_;
  local_48 = 0.0;
  dStack_40 = 0.0;
  if (0.0 <= dVar6) {
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      auVar10 = vsqrtsd_avx(auVar10,auVar10);
      dVar6 = auVar10._0_8_;
    }
    dVar6 = (auVar1._0_8_ + dVar6) * 0.5;
    if (0.0 <= dVar6) {
      local_48 = pow(dVar6,0.3333333333333333);
    }
    else {
      dVar6 = pow(-dVar6,0.3333333333333333);
      auVar12._0_8_ = -dVar6;
      auVar12._8_8_ = extraout_XMM0_Qb ^ 0x8000000000000000;
      local_48 = (double)vmovlpd_avx(auVar12);
    }
    dStack_40 = 0.0;
  }
  else {
    dVar7 = auVar1._0_8_ * 0.5;
    auVar14._0_8_ = -dVar6;
    auVar14._8_8_ = auVar10._8_8_ ^ 0x8000000000000000;
    if (-0.0 < dVar6) {
      dVar6 = sqrt(auVar14._0_8_);
    }
    else {
      auVar1 = vsqrtsd_avx(auVar14,auVar14);
      dVar6 = auVar1._0_8_;
    }
    dVar6 = dVar6 * 0.5;
    dVar8 = dVar7 * dVar7 + dVar6 * dVar6;
    if (dVar8 < 0.0) {
      local_58 = dVar6;
      dVar8 = sqrt(dVar8);
      dVar6 = local_58;
    }
    else {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar8;
      auVar1 = vsqrtsd_avx(auVar11,auVar11);
      dVar8 = auVar1._0_8_;
    }
    dVar6 = atan(dVar6 / dVar7);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar7;
    uVar4 = vcmpsd_avx512f(auVar16,ZEXT816(0),1);
    bVar5 = (bool)((byte)uVar4 & 1);
    local_58 = (double)((ulong)bVar5 * (long)(dVar6 + 3.141592653589793) +
                       (ulong)!bVar5 * (long)dVar6);
    dVar6 = pow(dVar8,0.3333333333333333);
    local_58 = local_58 / 3.0;
    dVar7 = cos(local_58);
    dStack_40 = sin(local_58);
    dStack_40 = dStack_40 * dVar6;
    local_48 = dVar7 * dVar6;
  }
  dVar6 = *pdVar2;
  local_68._M_value._0_8_ = 1.0;
  local_68._M_value._8_8_ = 0;
  std::complex<double>::operator*=(&local_68,(complex<double> *)&local_48);
  dVar7 = (double)local_68._M_value._0_8_ + pdVar2[1];
  local_68._M_value._0_8_ = 0x3ff0000000000000;
  local_68._M_value._8_8_ = 0;
  std::complex<double>::operator*=(&local_68,(complex<double> *)&local_48);
  dVar8 = (double)__divdc3(dVar9,0,local_68._M_value._0_8_,local_68._M_value._8_8_);
  dVar7 = (dVar8 + dVar7) * (-1.0 / (dVar6 * 3.0));
  dVar6 = *pdVar2;
  local_68._M_value._0_8_ = -0.5;
  local_68._M_value._8_8_ = 0x3febb67ae8584caa;
  std::complex<double>::operator*=(&local_68,(complex<double> *)&local_48);
  local_58 = (double)local_68._M_value._0_8_ + pdVar2[1];
  local_68._M_value._0_8_ = 0xbfe0000000000000;
  local_68._M_value._8_8_ = 0x3febb67ae8584caa;
  std::complex<double>::operator*=(&local_68,(complex<double> *)&local_48);
  local_28 = (double)__divdc3(dVar9,0,local_68._M_value._0_8_,local_68._M_value._8_8_);
  local_30 = *pdVar2 * 3.0;
  local_68._M_value._0_8_ = -0.5;
  local_68._M_value._8_8_ = 0xbfebb67ae8584caa;
  std::complex<double>::operator*=(&local_68,(complex<double> *)&local_48);
  local_38 = (double)local_68._M_value._0_8_ + pdVar2[1];
  local_68._M_value._0_8_ = 0xbfe0000000000000;
  local_68._M_value._8_8_ = 0xbfebb67ae8584caa;
  std::complex<double>::operator*=(&local_68,(complex<double> *)&local_48);
  dVar9 = (double)__divdc3(dVar9,0,local_68._M_value._0_8_,local_68._M_value._8_8_);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3._M_current =
       (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_68._M_value._0_8_ = dVar7;
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (__return_storage_ptr__,iVar3,(double *)&local_68);
  }
  else {
    *iVar3._M_current = dVar7;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  local_68._M_value._0_8_ = (-1.0 / (dVar6 * 3.0)) * (local_28 + local_58);
  iVar3._M_current =
       (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (__return_storage_ptr__,iVar3,(double *)&local_68);
  }
  else {
    *iVar3._M_current = (double)local_68._M_value._0_8_;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  local_68._M_value._0_8_ = (-1.0 / local_30) * (dVar9 + local_38);
  iVar3._M_current =
       (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (__return_storage_ptr__,iVar3,(double *)&local_68);
  }
  else {
    *iVar3._M_current = (double)local_68._M_value._0_8_;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar3._M_current + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double>
opengv::math::o3_roots( const std::vector<double> & p )
{
  const double & a = p[0];
  const double & b = p[1];
  const double & c = p[2];
  const double & d = p[3];
  
  double theta_0 = b*b - 3.0*a*c;
  double theta_1 = 2.0*b*b*b - 9.0*a*b*c + 27.0*a*a*d;
  double term = theta_1 * theta_1 - 4.0 * theta_0 * theta_0 * theta_0;
  
  std::complex<double> u1( 1.0, 0.0);
  std::complex<double> u2(-0.5, 0.5*sqrt(3.0));
  std::complex<double> u3(-0.5,-0.5*sqrt(3.0));
  std::complex<double> C;
  
  if( term >= 0.0 )
  {
    double C3 = 0.5 * (theta_1 + sqrt(term));
    
    if( C3 < 0.0 )
      C = std::complex<double>(-pow(-C3,(1.0/3.0)),0.0);
    else
      C = std::complex<double>( pow( C3,(1.0/3.0)),0.0);
  }
  else
  {
    std::complex<double> C3( 0.5*theta_1, 0.5*sqrt(-term) );
    
    //take the third root of this complex number
    double r3 = sqrt(pow(C3.real(),2.0)+pow(C3.imag(),2.0));
    double a3 = atan(C3.imag() / C3.real());
    if( C3.real() < 0 )
      a3 += M_PI;
    
    double r = pow(r3,(1.0/3.0));
    C = std::complex<double>(r*cos(a3/3.0),r*sin(a3/3.0));
  }
  
  std::complex<double> r1 = -(1.0/(3.0*a)) * (b + u1*C + theta_0 / (u1*C) );
  std::complex<double> r2 = -(1.0/(3.0*a)) * (b + u2*C + theta_0 / (u2*C) );
  std::complex<double> r3 = -(1.0/(3.0*a)) * (b + u3*C + theta_0 / (u3*C) );
  
  std::vector<double> roots;
  roots.push_back(r1.real());
  roots.push_back(r2.real());
  roots.push_back(r3.real());
  return roots;
}